

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * __thiscall google::protobuf::FastUInt32ToBufferLeft(protobuf *this,uint32 u,char *buffer)

{
  char *pcVar1;
  long lVar2;
  undefined4 in_register_00000034;
  char *ASCII_digits;
  uint32 digits;
  char *buffer_local;
  uint32 u_local;
  
  u_local = (uint32)this;
  pcVar1 = (char *)CONCAT44(in_register_00000034,u);
  if (u_local < 1000000000) {
    buffer_local = pcVar1;
    if (99 < u_local) {
      if (9999 < u_local) {
        if (999999 < u_local) {
          if (99999999 < u_local) {
            buffer_local = pcVar1 + 1;
            *pcVar1 = (char)(u_local / 100000000) + '0';
            goto LAB_004173d5;
          }
          if (9999999 < u_local) goto LAB_004173e7;
          digits = u_local / 1000000;
          buffer_local = pcVar1 + 1;
          *pcVar1 = (char)digits + '0';
          goto LAB_0041743c;
        }
        if (99999 < u_local) goto LAB_0041744e;
        digits = u_local / 10000;
        buffer_local = pcVar1 + 1;
        *pcVar1 = (char)digits + '0';
        goto LAB_004174a3;
      }
      if (999 < u_local) goto LAB_004174b5;
      digits = u_local / 100;
      buffer_local = pcVar1 + 1;
      *pcVar1 = (char)digits + '0';
      goto LAB_0041750a;
    }
    if (u_local < 10) {
      buffer_local = pcVar1 + 1;
      *pcVar1 = (char)this + '0';
      goto LAB_00417565;
    }
  }
  else {
    lVar2 = (ulong)(u_local / 100000000) * 2;
    *pcVar1 = two_ASCII_digits[lVar2];
    pcVar1[1] = two_ASCII_digits[lVar2 + 1];
    buffer_local = pcVar1 + 2;
LAB_004173d5:
    u_local = u_local % 100000000;
LAB_004173e7:
    digits = u_local / 1000000;
    *buffer_local = two_ASCII_digits[(ulong)digits * 2];
    buffer_local[1] = two_ASCII_digits[(ulong)digits * 2 + 1];
    buffer_local = buffer_local + 2;
LAB_0041743c:
    u_local = u_local + digits * -1000000;
LAB_0041744e:
    digits = u_local / 10000;
    *buffer_local = two_ASCII_digits[(ulong)digits * 2];
    buffer_local[1] = two_ASCII_digits[(ulong)digits * 2 + 1];
    buffer_local = buffer_local + 2;
LAB_004174a3:
    u_local = u_local + digits * -10000;
LAB_004174b5:
    digits = u_local / 100;
    *buffer_local = two_ASCII_digits[(ulong)digits * 2];
    buffer_local[1] = two_ASCII_digits[(ulong)digits * 2 + 1];
    buffer_local = buffer_local + 2;
LAB_0041750a:
    u_local = u_local + digits * -100;
  }
  *buffer_local = two_ASCII_digits[(ulong)u_local * 2];
  buffer_local[1] = two_ASCII_digits[(ulong)u_local * 2 + 1];
  buffer_local = buffer_local + 2;
LAB_00417565:
  *buffer_local = '\0';
  return buffer_local;
}

Assistant:

char* FastUInt32ToBufferLeft(uint32 u, char* buffer) {
  uint32 digits;
  const char *ASCII_digits = nullptr;
  // The idea of this implementation is to trim the number of divides to as few
  // as possible by using multiplication and subtraction rather than mod (%),
  // and by outputting two digits at a time rather than one.
  // The huge-number case is first, in the hopes that the compiler will output
  // that case in one branch-free block of code, and only output conditional
  // branches into it from below.
  if (u >= 1000000000) {  // >= 1,000,000,000
    digits = u / 100000000;  // 100,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100_000_000:
    u -= digits * 100000000;  // 100,000,000
lt100_000_000:
    digits = u / 1000000;  // 1,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt1_000_000:
    u -= digits * 1000000;  // 1,000,000
lt1_000_000:
    digits = u / 10000;  // 10,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt10_000:
    u -= digits * 10000;  // 10,000
lt10_000:
    digits = u / 100;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100:
    u -= digits * 100;
lt100:
    digits = u;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
done:
    *buffer = 0;
    return buffer;
  }

  if (u < 100) {
    digits = u;
    if (u >= 10) goto lt100;
    *buffer++ = '0' + digits;
    goto done;
  }
  if (u  <  10000) {   // 10,000
    if (u >= 1000) goto lt10_000;
    digits = u / 100;
    *buffer++ = '0' + digits;
    goto sublt100;
  }
  if (u  <  1000000) {   // 1,000,000
    if (u >= 100000) goto lt1_000_000;
    digits = u / 10000;  //    10,000
    *buffer++ = '0' + digits;
    goto sublt10_000;
  }
  if (u  <  100000000) {   // 100,000,000
    if (u >= 10000000) goto lt100_000_000;
    digits = u / 1000000;  //   1,000,000
    *buffer++ = '0' + digits;
    goto sublt1_000_000;
  }
  // we already know that u < 1,000,000,000
  digits = u / 100000000;   // 100,000,000
  *buffer++ = '0' + digits;
  goto sublt100_000_000;
}